

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::X<double>
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZFMatrix<double> *coord,TPZVec<double> *xi,
          TPZVec<double> *result)

{
  bool bVar1;
  MElementType MVar2;
  int iVar3;
  int x;
  long lVar4;
  TPZGeoBlend<pzgeom::TPZGeoPyramid> *pTVar5;
  int x_1;
  long lVar6;
  long lVar7;
  long lVar8;
  int x_4;
  double dVar9;
  TPZVec<double> *pTVar10;
  int side_1;
  int subSide;
  double blendFactorSide;
  TPZGeoElSide gelside;
  TPZFNMatrix<9,_double> sidePhi;
  TPZManVector<double,_3> projectedPoint;
  TPZManVector<double,_3> Xside;
  TPZManVector<double,_3> nodeCoord;
  TPZFNMatrix<9,_double> notUsedHereMat;
  TPZManVector<double,_3> notUsedHereVec;
  TPZFNMatrix<27,_double> projectedPointOverSide;
  TPZFNMatrix<27,_double> nonLinearSideMappings;
  TPZStack<int,_10> allContainedSides;
  TPZStack<int,_10> containedNodesInSide;
  TPZFNMatrix<27,_double> linearSideMappings;
  TPZManVector<double,_3> neighXi_1;
  TPZManVector<double,_3> sideXi;
  TPZGeoElSide neighbour;
  TPZFNMatrix<9,_double> phi;
  int local_aac;
  _func_int **local_aa8;
  _func_int **local_aa0;
  TPZGeoBlend<pzgeom::TPZGeoPyramid> *local_a98;
  double local_a90;
  int local_a84;
  TPZVec<double> *local_a80;
  TPZVec<double> *local_a78;
  double local_a70;
  pointer_____offset_0x18___ *local_a68;
  TPZGeoMesh *local_a60;
  double local_a58;
  undefined **local_a50;
  undefined **local_a48;
  _func_int **local_a40;
  _func_int **local_a38;
  undefined **local_a30;
  undefined6 *local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined6 uStack_a10;
  undefined2 uStack_a0a;
  undefined6 uStack_a08;
  TPZGeoElSideIndex *local_9f8;
  TPZGeoElSide local_9f0;
  TPZFMatrix<double> local_9d8;
  double local_948 [10];
  TPZVec<double> local_8f8;
  double adStack_8d8 [20];
  TPZManVector<double,_3> local_838;
  TPZManVector<double,_3> local_800;
  TPZManVector<double,_3> local_7c8;
  TPZFMatrix<double> local_790;
  double local_700 [10];
  TPZManVector<double,_3> local_6b0;
  TPZFMatrix<double> local_678;
  double local_5e8 [28];
  TPZFMatrix<double> local_508;
  double local_478 [28];
  TPZManVector<int,_10> local_398;
  TPZManVector<int,_10> local_350;
  TPZFMatrix<double> local_308;
  double local_278 [28];
  TPZManVector<double,_3> local_198;
  TPZManVector<double,_3> local_160;
  TPZGeoElSide local_128;
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  if (this->fGeoEl == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1f6);
  }
  local_a60 = this->fGeoEl->fMesh;
  local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  local_a78 = result;
  TPZManVector<double,_3>::TPZManVector(&local_6b0,3,(double *)&local_678);
  local_790.fElem = local_700;
  local_790.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0x13;
  local_790.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x13;
  local_790.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_790.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_a38 = (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_790.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_790.fSize = 9;
  local_790.fGiven = local_790.fElem;
  TPZVec<int>::TPZVec(&local_790.fPivot.super_TPZVec<int>,0);
  local_790.fPivot.super_TPZVec<int>.fStore = local_790.fPivot.fExtAlloc;
  local_aa0 = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_790.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_790.fPivot.super_TPZVec<int>.fNElements = 0;
  local_790.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_aa8 = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_790.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_790.fWork.fStore = (double *)0x0;
  local_790.fWork.fNElements = 0;
  local_790.fWork.fNAlloc = 0;
  local_790.fElem = (double *)operator_new__(0xb48);
  local_a40 = (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_790.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_a98 = this;
  TPZFMatrix<double>::operator=(&local_790,0.0);
  pTVar10 = local_a78;
  (*local_a78->_vptr_TPZVec[3])(local_a78,3);
  local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZVec<double>::Fill(pTVar10,(double *)&local_678,0,-1);
  if (local_a98->fNeighbours[0xd].fGeoElIndex == -1) {
    local_110.fElem = local_80;
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 5;
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         local_a38;
    local_110.fSize = 9;
    local_110.fGiven = local_110.fElem;
    TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
    local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
    local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = local_aa0;
    local_110.fPivot.super_TPZVec<int>.fNElements = 0;
    local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_110.fWork._vptr_TPZVec = local_aa8;
    local_110.fWork.fStore = (double *)0x0;
    local_110.fWork.fNElements = 0;
    local_110.fWork.fNAlloc = 0;
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         local_a40;
    local_a80 = xi;
    pztopology::TPZPyramid::TShape<double>(xi,&local_110,&local_790);
    pTVar10 = local_a80;
    local_9f8 = local_a98->fNeighbours;
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar4 = 0;
      do {
        if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar4) ||
           ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
           (local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_a78->fStore[lVar4] =
             *(double *)
              ((long)coord->fElem +
              lVar4 * 8 + (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar7) *
             local_110.fElem[lVar6] + local_a78->fStore[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar6 != 5);
    local_a28 = &uStack_a10;
    local_a48 = &PTR__TPZManVector_018c1a40;
    local_a30 = &PTR__TPZManVector_018c1a40;
    uStack_a20 = 0xe;
    local_a18 = 0;
    uStack_a10 = 0;
    uStack_a0a = 0;
    uStack_a08 = 0;
    lVar6 = -0xd;
    do {
      local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_
           = (int)lVar6 + 0x12;
      bVar1 = pztopology::TPZPyramid::CheckProjectionForSingularity<double>
                        ((int *)&local_678,pTVar10);
      *(bool *)((long)local_a28 + lVar6 + 0xd) = bVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0);
    TPZVec<double>::TPZVec(&local_8f8,0);
    local_8f8.fStore = adStack_8d8;
    local_a50 = &PTR__TPZManVector_018c1ae8;
    local_8f8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018c1ae8;
    local_8f8.fNElements = 0xe;
    local_8f8.fNAlloc = 0;
    adStack_8d8[0] = 0.0;
    adStack_8d8[1] = 0.0;
    adStack_8d8[2] = 0.0;
    adStack_8d8[3] = 0.0;
    adStack_8d8[4] = 0.0;
    adStack_8d8[5] = 0.0;
    adStack_8d8[6] = 0.0;
    adStack_8d8[7] = 0.0;
    adStack_8d8[8] = 0.0;
    adStack_8d8[9] = 0.0;
    adStack_8d8[10] = 0.0;
    adStack_8d8[0xb] = 0.0;
    adStack_8d8[0xc] = 0.0;
    adStack_8d8[0xd] = 0.0;
    local_678.fElem = local_5e8;
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0xe;
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018c1e38;
    local_678.fSize = 0x1b;
    local_678.fGiven = local_678.fElem;
    TPZVec<int>::TPZVec(&local_678.fPivot.super_TPZVec<int>,0);
    local_678.fPivot.super_TPZVec<int>.fStore = local_678.fPivot.fExtAlloc;
    local_678.fPivot.super_TPZVec<int>._vptr_TPZVec = local_aa0;
    local_678.fPivot.super_TPZVec<int>.fNElements = 0;
    local_678.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_678.fWork._vptr_TPZVec = local_aa8;
    local_678.fWork.fStore = (double *)0x0;
    local_678.fWork.fNElements = 0;
    local_678.fWork.fNAlloc = 0;
    local_678.fElem = (double *)operator_new__(0x150);
    local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018c1b48;
    TPZFMatrix<double>::operator=(&local_678,0.0);
    local_308.fElem = local_278;
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0xe;
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018c1e38;
    local_308.fSize = 0x1b;
    local_308.fGiven = local_308.fElem;
    TPZVec<int>::TPZVec(&local_308.fPivot.super_TPZVec<int>,0);
    local_308.fPivot.super_TPZVec<int>.fStore = local_308.fPivot.fExtAlloc;
    local_308.fPivot.super_TPZVec<int>._vptr_TPZVec = local_aa0;
    local_308.fPivot.super_TPZVec<int>.fNElements = 0;
    local_308.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_308.fWork._vptr_TPZVec = local_aa8;
    local_308.fWork.fStore = (double *)0x0;
    local_308.fWork.fNElements = 0;
    local_308.fWork.fNAlloc = 0;
    local_308.fElem = (double *)operator_new__(0x150);
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018c1b48;
    TPZFMatrix<double>::operator=(&local_308,0.0);
    local_508.fElem = local_478;
    local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0xe;
    local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018c1e38;
    local_508.fSize = 0x1b;
    local_508.fGiven = local_508.fElem;
    TPZVec<int>::TPZVec(&local_508.fPivot.super_TPZVec<int>,0);
    local_508.fPivot.super_TPZVec<int>.fStore = local_508.fPivot.fExtAlloc;
    local_508.fPivot.super_TPZVec<int>._vptr_TPZVec = local_aa0;
    local_508.fPivot.super_TPZVec<int>.fNElements = 0;
    local_508.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_508.fWork._vptr_TPZVec = local_aa8;
    local_508.fWork.fStore = (double *)0x0;
    local_508.fWork.fNElements = 0;
    local_508.fWork.fNAlloc = 0;
    local_508.fElem = (double *)operator_new__(0x150);
    pTVar5 = local_a98;
    local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018c1b48;
    TPZFMatrix<double>::operator=(&local_508,0.0);
    local_a68 = &PTR_PTR_0183dba8;
    lVar6 = 0;
    do {
      local_aac = (int)lVar6 + 5;
      if (*(char *)((long)local_a28 + lVar6) == '\x01') {
        TPZGeoElSide::TPZGeoElSide(&local_9f0,local_9f8 + lVar6,local_a60);
        bVar1 = IsLinearMapping(pTVar5,local_aac);
        if (((bVar1) || (local_9f0.fGeoEl == (TPZGeoEl *)0x0)) || (local_9f0.fSide < 0)) {
          local_8f8.fStore[lVar6] = 0.0;
        }
        else {
          TPZManVector<double,_3>::TPZManVector(&local_160,0);
          pztopology::TPZPyramid::MapToSide<double>
                    (local_aac,local_a80,&local_160.super_TPZVec<double>,&local_790);
          MVar2 = pztopology::TPZPyramid::Type(local_aac);
          switch(MVar2) {
          case EPoint:
            MVar2 = EOned;
            break;
          case EOned:
            MVar2 = ETriangle;
            break;
          case ETriangle:
            MVar2 = EQuadrilateral;
            break;
          case EQuadrilateral:
            MVar2 = ETetraedro;
            break;
          case ETetraedro:
          case EPiramide:
          case EPrisma:
            break;
          case ECube:
            MVar2 = EPolygonal;
            break;
          default:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ElementType not found!",0x16);
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Common/pzeltype.h"
                       ,0x77);
          }
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               local_a38;
          local_9d8.fSize = 9;
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)(int)MVar2;
          local_9d8.fElem = local_948;
          local_9d8.fGiven = local_948;
          TPZVec<int>::TPZVec(&local_9d8.fPivot.super_TPZVec<int>,0);
          local_9d8.fPivot.super_TPZVec<int>._vptr_TPZVec = local_aa0;
          local_9d8.fPivot.super_TPZVec<int>.fStore = local_9d8.fPivot.fExtAlloc;
          local_9d8.fPivot.super_TPZVec<int>.fNElements = 0;
          local_9d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_9d8.fWork._vptr_TPZVec = local_aa8;
          local_9d8.fWork.fStore = (double *)0x0;
          local_9d8.fWork.fNElements = 0;
          local_9d8.fWork.fNAlloc = 0;
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               local_a40;
          TPZFMatrix<double>::Resize(&local_790,3,(long)(int)MVar2);
          GetSideShapeFunction<pzgeom::TPZGeoPyramid>
                    (local_aac,&local_160.super_TPZVec<double>,&local_9d8,&local_790);
          TPZManVector<double,_3>::TPZManVector(&local_7c8,0);
          if ((int)MVar2 < 2) {
            MVar2 = EOned;
          }
          local_a58 = (double)(ulong)MVar2;
          dVar9 = 0.0;
          do {
            iVar3 = pztopology::TPZPyramid::SideNodeLocId(local_aac,SUB84(dVar9,0));
            lVar7 = 0;
            do {
              if ((((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7) ||
                  (iVar3 < 0)) ||
                 ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)iVar3)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)dVar9) ||
                 (local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_a90 = local_9d8.fElem[(long)dVar9];
              if ((local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                 (local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_308.fElem
              [local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar6] =
                   coord->fElem
                   [(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * (long)iVar3 + lVar7]
                   * local_a90 +
                   local_308.fElem
                   [local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar6];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            pztopology::TPZPyramid::ParametricDomainNodeCoord(iVar3,&local_7c8.super_TPZVec<double>)
            ;
            lVar7 = 0;
            do {
              if ((local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)dVar9) ||
                 (local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_a90 = local_9d8.fElem[(long)dVar9];
              if ((local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                 (local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_678.fElem
              [local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar6] =
                   local_7c8.super_TPZVec<double>.fStore[lVar7] * local_a90 +
                   local_678.fElem
                   [local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar6];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar9 != local_a58);
          pztopology::TPZPyramid::BlendFactorForSide<double>
                    (&local_aac,local_a80,local_8f8.fStore + lVar6,&local_6b0.super_TPZVec<double>);
          iVar3 = TPZGeoElSide::Dimension(&local_9f0);
          pTVar10 = local_a78;
          TPZManVector<double,_3>::TPZManVector(&local_198,0);
          bVar1 = MapToNeighSide<double>
                            (local_a98,local_aac,iVar3,local_a80,&local_198.super_TPZVec<double>,
                             &local_790);
          pTVar5 = local_a98;
          if (bVar1) {
            local_350.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x0;
            TPZManVector<double,_3>::TPZManVector(&local_800,3,(double *)&local_350);
            Neighbour(&local_128,pTVar5,local_aac,local_a60);
            TPZGeoElSide::X(&local_128,&local_198.super_TPZVec<double>,
                            &local_800.super_TPZVec<double>);
            lVar7 = 0;
            do {
              if ((local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                 (local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_508.fElem
              [local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar6] =
                   local_800.super_TPZVec<double>.fStore[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_350);
            pztopology::TPZPyramid::LowerDimensionSides(local_aac,(TPZStack<int,_10> *)&local_350,0)
            ;
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_398);
            pztopology::TPZPyramid::LowerDimensionSides(local_aac,(TPZStack<int,_10> *)&local_398);
            for (lVar7 = (long)(int)local_350.super_TPZVec<int>.fNElements;
                lVar7 < local_398.super_TPZVec<int>.fNElements; lVar7 = lVar7 + 1) {
              local_a84 = local_398.super_TPZVec<int>.fStore[lVar7];
              if ((*(char *)((long)local_a28 + (long)local_a84 + -5) != '\0') &&
                 (bVar1 = IsLinearMapping(local_a98,local_a84), !bVar1)) {
                local_a70 = -1.0;
                TPZManVector<double,_3>::TPZManVector(&local_838,3,&local_a70);
                lVar4 = 0;
                do {
                  if ((local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                     (local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_838.super_TPZVec<double>.fStore[lVar4] =
                       local_678.fElem
                       [local_678.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4 + lVar6];
                  lVar4 = lVar4 + 1;
                } while (lVar4 != 3);
                local_a70 = -1.0;
                pztopology::TPZPyramid::BlendFactorForSide<double>
                          (&local_a84,&local_838.super_TPZVec<double>,&local_a70,
                           &local_6b0.super_TPZVec<double>);
                lVar4 = 0;
                do {
                  lVar8 = (long)local_a84;
                  if (((lVar8 < 5) ||
                      (local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8 + -5)) ||
                     (local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_a90 = local_508.fElem
                              [local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4 +
                               lVar8 + -5];
                  lVar8 = (long)local_a84;
                  if (((lVar8 < 5) ||
                      (local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8 + -5)) ||
                     (local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_a58 = local_308.fElem
                              [local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4 +
                               lVar8 + -5];
                  if ((local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                     (local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_508.fElem
                  [local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4 + lVar6] =
                       local_508.fElem
                       [local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4 + lVar6]
                       - local_a70 * (local_a90 - local_a58);
                  lVar4 = lVar4 + 1;
                } while (lVar4 != 3);
                TPZManVector<double,_3>::~TPZManVector(&local_838);
                pTVar10 = local_a78;
              }
            }
            lVar7 = 0;
            do {
              if ((local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                 (local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_a90 = local_508.fElem
                          [local_508.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 +
                           lVar6];
              if ((local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                 (local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pTVar10->fStore[lVar7] =
                   local_8f8.fStore[lVar6] *
                   (local_a90 -
                   local_308.fElem
                   [local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar6]) +
                   pTVar10->fStore[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            TPZManVector<int,_10>::~TPZManVector(&local_398);
            TPZManVector<int,_10>::~TPZManVector(&local_350);
            TPZManVector<double,_3>::~TPZManVector(&local_800);
          }
          pTVar5 = local_a98;
          TPZManVector<double,_3>::~TPZManVector(&local_198);
          TPZManVector<double,_3>::~TPZManVector(&local_7c8);
          TPZFMatrix<double>::~TPZFMatrix(&local_9d8,local_a68);
          TPZManVector<double,_3>::~TPZManVector(&local_160);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xd);
    TPZFMatrix<double>::~TPZFMatrix(&local_508,&PTR_PTR_018c1e00);
    TPZFMatrix<double>::~TPZFMatrix(&local_308,&PTR_PTR_018c1e00);
    TPZFMatrix<double>::~TPZFMatrix(&local_678,&PTR_PTR_018c1e00);
    if (local_8f8.fStore == adStack_8d8) {
      local_8f8.fStore = (double *)0x0;
    }
    local_8f8.fNAlloc = 0;
    local_8f8._vptr_TPZVec = local_aa8;
    if (local_8f8.fStore != (double *)0x0) {
      operator_delete__(local_8f8.fStore);
    }
    if (local_a28 == &uStack_a10) {
      local_a28 = (undefined6 *)0x0;
    }
    local_a18 = 0;
    local_a30 = &PTR__TPZVec_018c1aa8;
    if (local_a28 != (undefined6 *)0x0) {
      operator_delete__(local_a28);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_110,local_a68);
  }
  else {
    TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)&local_678,0);
    bVar1 = MapToNeighSide<double>(local_a98,0x12,3,xi,(TPZVec<double> *)&local_678,&local_790);
    if (!bVar1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
                 ,0x215);
    }
    TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)&local_308,local_a98->fNeighbours + 0xd,local_a60);
    TPZGeoElSide::X((TPZGeoElSide *)&local_308,(TPZVec<double> *)&local_678,pTVar10);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&local_678);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_790,&PTR_PTR_0183dba8);
  TPZManVector<double,_3>::~TPZManVector(&local_6b0);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::X(TPZFMatrix<REAL> &coord, TPZVec<T> &xi, TPZVec<T> &result) const {
//    TPZGeoEl &gel = *fGeoEl;
    if(!fGeoEl) DebugStop();
    TPZGeoMesh *gmesh = fGeoEl->Mesh();
    TPZManVector<T,3> notUsedHereVec(3,(T)0);
    TPZFNMatrix<9,T> notUsedHereMat(TGeo::NSides, TGeo::NSides,(T)0);//since some methods dont resize the matrix, it is
    // bigger than needed.

    #ifdef PZ_LOG
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::X2_______REF_1"<<std::endl;
        soutLogDebug << "element id " <<fGeoEl->Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xi.size(); i++) soutLogDebug<<xi[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif
    const REAL zero = 1e-14;
    result.Resize(3);
    result.Fill(0);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        Neighbour(TGeo::NSides-1, gmesh).X(neighXi, result);
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1);
    TGeo::TShape(xi, phi, notUsedHereMat);//gets the barycentric coordinates


    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for (int x = 0; x < 3; x++) {
            result[x] += coord(x, iNode) * phi(iNode, 0);
        }
    }
    #ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "Linear mapping:\n"<<std::endl;
        for(int i = 0; i < result.size(); i++) soutLogDebug<<result[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif

    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */
    TPZManVector<bool, 20> isRegularMapping(TGeo::NSides - TGeo::NNodes, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        isRegularMapping[sideIndex] = TGeo::CheckProjectionForSingularity(side,xi);
    }

    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, 0.);
    TPZFNMatrix<27, T> projectedPointOverSide(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, 0.);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        if(!isRegularMapping[sideIndex]) {
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                soutLogDebug <<"mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            soutLogDebug << "================================" <<std::endl;
            soutLogDebug << "side: "<<side<<" is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                if( IsLinearMapping(side) )  soutLogDebug <<"true"<<std::endl;
                else    soutLogDebug <<"false (no gelside) "<<std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"false (gelside exists) "<<std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3>  sideXi;
        this->MapToSide(side, xi, sideXi, notUsedHereMat);

        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        TPZFNMatrix<9, T> sidePhi(nSideNodes, 1);
        notUsedHereMat.Resize(TGeo::Dimension,nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhi, notUsedHereMat);

        TPZManVector<REAL,3> nodeCoord;
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhi(iNode, 0);
            }
            TGeo::ParametricDomainNodeCoord(currentNode,nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPointOverSide(sideIndex,x) += nodeCoord[x] * sidePhi(iNode,0);
            }
        }
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"xi projection over side:\n";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug<<projectedPointOverSide(sideIndex,x)<<"\n";
            soutLogDebug<<std::endl<<"xi projection in side domain:\n";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug<<sideXi[x]<<"\n";
            soutLogDebug<<std::endl<<"linear mapping of projected point:\n";
            for (int x = 0; x < 3; x++) soutLogDebug<<linearSideMappings(sideIndex, x)<<"\n";
        }
        #endif

        TGeo::BlendFactorForSide(side, xi, blendFactor[sideIndex], notUsedHereVec);
        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(side, sidedim, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        TPZGeoElSide neighbour = Neighbour(side, gmesh);
        neighbour.X(neighXi, Xside);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if(!isRegularMapping[subSide - TGeo::NNodes]) {
                #ifdef PZ_LOG
                if(logger.isDebugEnabled()){
                    soutLogDebug <<"mapping of subside is not regular. skipping side... ";

                }
                #endif
                continue;
            }
            if (IsLinearMapping(subSide)) continue;
            TPZManVector<T, 3> projectedPoint(TGeo::Dimension, -1);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPoint[x] = projectedPointOverSide(sideIndex, x);
            }

            T blendFactorSide = -1;
            TGeo::BlendFactorForSide(subSide, projectedPoint, blendFactorSide,notUsedHereVec);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
            }

        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping\n";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\n";
            soutLogDebug << std::endl;

            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tblend factor: " << blendFactor[sideIndex] << std::endl;
//            LOGPZ_DEBUG(logger,soutLogDebug.str())
//            soutLogDebug.str("");
        }
#endif
        for (int x = 0; x < 3; x++) {
            result[x] += blendFactor[sideIndex] *
                         (nonLinearSideMappings(sideIndex, x) - linearSideMappings(sideIndex, x));
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for (int x = 0; x < 3; x++) soutLogDebug<<result[x]<<"\n";
        soutLogDebug << "\n================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
}